

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O1

bool __thiscall ExternalTester::testAllPWLocal(ExternalTester *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  int *piVar7;
  long lVar8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  _Var9;
  ostream *poVar10;
  undefined8 *puVar11;
  int i;
  long lVar12;
  char *pcVar13;
  long lVar14;
  int i_1;
  value_type_conflict1 *__val;
  double dVar15;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  vector<int,_std::allocator<int>_> indx;
  vector<double,_std::allocator<double>_> tols1;
  vector<double,_std::allocator<double>_> vals;
  vector<double,_std::allocator<double>_> pnts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  smap;
  long *local_1b8;
  long lStack_1b0;
  long local_1a8 [2];
  vector<double,_std::allocator<double>_> local_198;
  vector<double,_std::allocator<double>_> *local_178;
  undefined8 uStack_170;
  long local_168;
  vector<double,_std::allocator<double>_> local_158;
  TwoOneExpNX2 *local_140;
  vector<double,_std::allocator<double>_> local_138;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  local_120 [5];
  
  piVar7 = (int *)operator_new(0x78);
  lVar8 = 0;
  do {
    *(undefined4 *)((long)piVar7 + lVar8) = 8;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x78);
  memcpy(local_120,&DAT_00134580,0xf0);
  __l._M_len = 0x1e;
  __l._M_array = (iterator)local_120;
  std::vector<double,_std::allocator<double>_>::vector(&local_198,__l,(allocator_type *)&local_1b8);
  local_140 = &this->f21nx2;
  bVar5 = testLocalPolynomialRule
                    (this,&local_140->super_BaseFunction,rule_semilocalp,piVar7,
                     local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar5) {
    bVar5 = true;
    if (this->verbose == true) {
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x23;
      local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0x27;
      TasGrid::IO::getStringRuleMap_abi_cxx11_();
      p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
      local_178 = &local_158;
      _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
      {
        do {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                  ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                                *)&local_178,_Var9);
          if (bVar6) break;
          _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
        } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
      }
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
                 (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
      ::~_Rb_tree(local_120);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Pass",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
    }
  }
  else {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x23
    ;
    local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0x27;
    TasGrid::IO::getStringRuleMap_abi_cxx11_();
    p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
    local_178 = &local_158;
    _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      do {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                              *)&local_178,_Var9);
        if (bVar5) break;
        _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
      } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
    }
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
               (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
    ::~_Rb_tree(local_120);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
    *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"FAIL",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    bVar5 = false;
  }
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(piVar7,0x78);
  piVar7 = (int *)operator_new(0x78);
  lVar8 = 0;
  do {
    *(undefined4 *)((long)piVar7 + lVar8) = 8;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x78);
  memcpy(local_120,&DAT_00134580,0xf0);
  __l_00._M_len = 0x1e;
  __l_00._M_array = (iterator)local_120;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_198,__l_00,(allocator_type *)&local_1b8);
  bVar6 = testLocalPolynomialRule
                    (this,&local_140->super_BaseFunction,rule_localp,piVar7,
                     local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar6) {
    if (this->verbose == true) {
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x23;
      local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0x25;
      TasGrid::IO::getStringRuleMap_abi_cxx11_();
      p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
      local_178 = &local_158;
      _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
      {
        do {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                  ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                                *)&local_178,_Var9);
          if (bVar6) break;
          _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
        } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
      }
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
                 (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
      ::~_Rb_tree(local_120);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Pass",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
    }
  }
  else {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x23
    ;
    local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0x25;
    TasGrid::IO::getStringRuleMap_abi_cxx11_();
    p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
    local_178 = &local_158;
    _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      do {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                              *)&local_178,_Var9);
        if (bVar5) break;
        _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
      } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
    }
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
               (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
    ::~_Rb_tree(local_120);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
    *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"FAIL",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    bVar5 = false;
  }
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(piVar7,0x78);
  piVar7 = (int *)operator_new(0x78);
  lVar8 = 0;
  do {
    *(undefined4 *)((long)piVar7 + lVar8) = 8;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x78);
  memcpy(local_120,&DAT_00134670,0xf0);
  __l_01._M_len = 0x1e;
  __l_01._M_array = (iterator)local_120;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_198,__l_01,(allocator_type *)&local_1b8);
  bVar6 = testLocalPolynomialRule
                    (this,&(this->f21sincosaxis).super_BaseFunction,rule_localpb,piVar7,
                     local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar6) {
    if (this->verbose == true) {
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x23;
      local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0x28;
      TasGrid::IO::getStringRuleMap_abi_cxx11_();
      p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
      local_178 = &local_158;
      _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
      {
        do {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                  ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                                *)&local_178,_Var9);
          if (bVar6) break;
          _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
        } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
      }
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
                 (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
      ::~_Rb_tree(local_120);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Pass",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
    }
  }
  else {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x23
    ;
    local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0x28;
    TasGrid::IO::getStringRuleMap_abi_cxx11_();
    p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
    local_178 = &local_158;
    _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      do {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                              *)&local_178,_Var9);
        if (bVar5) break;
        _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
      } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
    }
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
               (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
    ::~_Rb_tree(local_120);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
    *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"FAIL",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    bVar5 = false;
  }
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(piVar7,0x78);
  piVar7 = (int *)operator_new(0x78);
  lVar8 = 0;
  do {
    *(undefined4 *)((long)piVar7 + lVar8) = 8;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x78);
  memcpy(local_120,&DAT_00134760,0xf0);
  __l_02._M_len = 0x1e;
  __l_02._M_array = (iterator)local_120;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_198,__l_02,(allocator_type *)&local_1b8);
  bVar6 = testLocalPolynomialRule
                    (this,&(this->f21coscos).super_BaseFunction,rule_localp0,piVar7,
                     local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar6) {
    if (this->verbose == true) {
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x23;
      local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0x26;
      TasGrid::IO::getStringRuleMap_abi_cxx11_();
      p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
      local_178 = &local_158;
      _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
      {
        do {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                  ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                                *)&local_178,_Var9);
          if (bVar6) break;
          _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
        } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
      }
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
                 (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
      ::~_Rb_tree(local_120);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Pass",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
    }
  }
  else {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rule",4);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x23
    ;
    local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0x26;
    TasGrid::IO::getStringRuleMap_abi_cxx11_();
    p_Var1 = &local_120[0]._M_impl.super__Rb_tree_header;
    local_178 = &local_158;
    _Var9._M_node = local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_120[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      do {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                              *)&local_178,_Var9);
        if (bVar5) break;
        _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
      } while ((_Rb_tree_header *)_Var9._M_node != p_Var1);
    }
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,*(long *)(_Var9._M_node + 1),
               (long)&(_Var9._M_node[1]._M_parent)->_M_color + *(long *)(_Var9._M_node + 1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
    ::~_Rb_tree(local_120);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1b8,lStack_1b0);
    *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0xf;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"FAIL",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    bVar5 = false;
  }
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(piVar7,0x78);
  local_1b8 = (long *)0x0;
  lStack_1b0 = 0;
  local_1a8[0] = 0;
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)local_120);
  TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
            ((int)local_120,2,1,4,rule_clenshawcurtis,(vector *)0x25);
  if (local_1b8 != (long *)0x0) {
    operator_delete(local_1b8,local_1a8[0] - (long)local_1b8);
  }
  local_1a8[0] = 0;
  local_1b8 = (long *)0x0;
  lStack_1b0 = 0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168 = 0;
  local_178 = (vector<double,_std::allocator<double>_> *)0x0;
  uStack_170 = 0;
  genRandom(&local_158,10,2);
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
            ((vector *)local_120,(vector *)&local_158,(vector *)&local_198,(vector *)&local_1b8);
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getError(this,&local_140->super_BaseFunction,(TasmanianSparseGrid *)local_120,
           type_internal_interpolation,&local_138);
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar8 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  puVar11 = (undefined8 *)operator_new(0x50);
  puVar11[8] = 0;
  puVar11[9] = 0;
  puVar11[6] = 0;
  puVar11[7] = 0;
  puVar11[4] = 0;
  puVar11[5] = 0;
  puVar11[2] = 0;
  puVar11[3] = 0;
  *puVar11 = 0;
  puVar11[1] = 0;
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)local_120,
             (int)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,(double *)0xa);
  lVar12 = 0;
  do {
    iVar2 = *(int *)((long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12 * 4);
    lVar14 = (long)iVar2;
    iVar3 = *(int *)((long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12 * 4 + 4);
    if (iVar2 < iVar3) {
      dVar15 = (double)puVar11[lVar12];
      do {
        dVar15 = dVar15 - *(double *)(lVar8 + (long)*(int *)((long)local_1b8 + lVar14 * 4) * 8) *
                          *(double *)((long)local_178 + lVar14 * 8);
        puVar11[lVar12] = dVar15;
        lVar14 = lVar14 + 1;
      } while (iVar3 != lVar14);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 10);
  lVar8 = 0;
  do {
    if (1e-12 < ABS((double)puVar11[lVar8])) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error in evaluateSparseHierarchicalFunctions() (localp)",
                 0x37);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      bVar5 = false;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  operator_delete(puVar11,0x50);
  pvVar4 = (void *)CONCAT44(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_158.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_158.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (local_178 != (vector<double,_std::allocator<double>_> *)0x0) {
    operator_delete(local_178,local_168 - (long)local_178);
  }
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8 != (long *)0x0) {
    operator_delete(local_1b8,local_1a8[0] - (long)local_1b8);
  }
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_120);
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0xb;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rules",5);
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"local polynomial",0x10);
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0xf;
  pcVar13 = "FAIL";
  if (bVar5 != false) {
    pcVar13 = "Pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return bVar5;
}

Assistant:

bool ExternalTester::testAllPWLocal() const{
    bool pass = true;
    int wfirst = 10, wsecond = 35, wthird = 15;

    { TasGrid::TypeOneDRule oned = TasGrid::rule_semilocalp;
      const std::vector<int> depths1(30, 8);
      // Tolerances for semi-local quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 1.E-01, 1.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-03, 1.E-03, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-04, 1.E-04, // order 3
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05, // order 4
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05 }; // order -1
      if (testLocalPolynomialRule(&f21nx2, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localp;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 1.E-01, 1.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-03, 1.E-03, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-04, 1.E-04, // order 3
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05, // order 4
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05 }; // order -1
      if (testLocalPolynomialRule(&f21nx2, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localpb;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local-boundary quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 5.E-01, 5.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-02, 1.E-02, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-03, 1.E-03, // order 3
                                          1.E-07, 9.E-06, 9.E-06, 9.E-05, 9.E-05, // order 4
                                          1.E-06, 2.E-05, 2.E-05, 2.E-04, 2.E-04 }; // order -1
      if (testLocalPolynomialRule(&f21sincosaxis, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localp0;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local-zero quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 2.E-04, 2.E-04, 2.E-02, 2.E-02, // order 1
                                          1.E-09, 1.E-06, 1.E-06, 1.E-04, 1.E-04, // order 2
                                          1.E-09, 3.E-08, 3.E-08, 3.E-06, 3.E-06, // order 3
                                          1.E-09, 4.E-09, 4.E-09, 4.E-08, 4.E-08, // order 4
                                          1.E-09, 4.E-09, 4.E-09, 4.E-08, 4.E-08}; // order -1
      if (testLocalPolynomialRule(&f21coscos, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TasmanianSparseGrid grid = makeLocalPolynomialGrid(2, 1, 4, 1);
        std::vector<int> indx, pntr;
        std::vector<double> vals;
        std::vector<double> pnts = genRandom(10, 2);
        grid.evaluateSparseHierarchicalFunctions(pnts, pntr, indx, vals);
        getError(&f21nx2, grid, type_internal_interpolation); // this is done to load the values
        const double *coeff = grid.getHierarchicalCoefficients();
        std::vector<double> y(10);
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++){
                y[i] -= coeff[indx[j]] * vals[j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in evaluateSparseHierarchicalFunctions() (localp)" << endl;
                pass = false;
            }
        }
    }
    wfirst = 11; wsecond = 34;
    if (pass){
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "local polynomial" << setw(wthird) << "Pass" << endl;
    }else{
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "local polynomial" << setw(wthird) << "FAIL" << endl;
    }
    return pass;
}